

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

basic_string_view<char,_std::char_traits<char>_> * __thiscall
frozen::bits::
LowerBound<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
::doitfirst<std::basic_string_view<char,std::char_traits<char>>const*,5ul>
          (void *param_1,less<std::basic_string_view<char,_std::char_traits<char>_>_> *param_2)

{
  bool bVar1;
  unsigned_long next;
  basic_string_view<char,_std::char_traits<char>_> *it;
  size_t next_start;
  size_t next_power;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> *plVar2;
  basic_string_view<char,_std::char_traits<char>_> *local_8;
  
  plVar2 = param_2;
  bVar1 = std::less<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (param_2,(basic_string_view<char,_std::char_traits<char>_> *)0x8,
                     (basic_string_view<char,_std::char_traits<char>_> *)0x3);
  if (bVar1) {
    local_8 = doitfirst<std::basic_string_view<char,std::char_traits<char>>const*>
                        ((LowerBound<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)param_1,param_2 + 0x40);
  }
  else {
    local_8 = doit_fast<std::basic_string_view<char,std::char_traits<char>>const*,3ul>
                        ((LowerBound<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)param_1,plVar2);
  }
  return local_8;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }